

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

DdNode * Llb_NonlinCreateCube1(Llb_Mgr_t *p,Llb_Prt_t *pPart)

{
  int iVar1;
  DdManager *pDVar2;
  abctime aVar3;
  Vec_Int_t *pVVar4;
  DdNode *pDVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  DdNode *f;
  
  pDVar2 = p->dd;
  aVar3 = pDVar2->TimeStop;
  pDVar2->TimeStop = 0;
  pDVar5 = Cudd_ReadOne(pDVar2);
  Cudd_Ref(pDVar5);
  pVVar6 = pPart->vVars;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    f = pDVar5;
    do {
      pVVar4 = p->pVars[pVVar6->pArray[lVar7]]->vParts;
      iVar1 = pVVar4->nSize;
      if (iVar1 < 1) {
        __assert_fail("Vec_IntSize(pVar->vParts) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb3Image.c"
                      ,0x95,"DdNode *Llb_NonlinCreateCube1(Llb_Mgr_t *, Llb_Prt_t *)");
      }
      pDVar5 = f;
      if (iVar1 == 1) {
        if (*pVVar4->pArray != pPart->iPart) {
          __assert_fail("Vec_IntEntry(pVar->vParts, 0) == pPart->iPart",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb3Image.c"
                        ,0x98,"DdNode *Llb_NonlinCreateCube1(Llb_Mgr_t *, Llb_Prt_t *)");
        }
        pDVar2 = p->dd;
        pDVar5 = Cudd_bddIthVar(pDVar2,p->pVars[pVVar6->pArray[lVar7]]->iVar);
        pDVar5 = Cudd_bddAnd(pDVar2,f,pDVar5);
        Cudd_Ref(pDVar5);
        Cudd_RecursiveDeref(p->dd,f);
      }
      lVar7 = lVar7 + 1;
      pVVar6 = pPart->vVars;
      f = pDVar5;
    } while (lVar7 < pVVar6->nSize);
  }
  Cudd_Deref(pDVar5);
  p->dd->TimeStop = aVar3;
  return pDVar5;
}

Assistant:

DdNode * Llb_NonlinCreateCube1( Llb_Mgr_t * p, Llb_Prt_t * pPart )
{
    DdNode * bCube, * bTemp;
    Llb_Var_t * pVar;
    int i;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bCube = Cudd_ReadOne(p->dd);   Cudd_Ref( bCube );
    Llb_PartForEachVar( p, pPart, pVar, i )
    {
        assert( Vec_IntSize(pVar->vParts) > 0 );
        if ( Vec_IntSize(pVar->vParts) != 1 )
            continue;
        assert( Vec_IntEntry(pVar->vParts, 0) == pPart->iPart );
        bCube = Cudd_bddAnd( p->dd, bTemp = bCube, Cudd_bddIthVar(p->dd, pVar->iVar) );    Cudd_Ref( bCube );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Cudd_Deref( bCube );
    p->dd->TimeStop = TimeStop;
    return bCube;
}